

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_cwksp *ws;
  ZSTD_compressedBlockState_t *pZVar1;
  int iVar2;
  ZSTD_cwksp_alloc_phase_e ZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  seqDef *psVar5;
  ldmEntry_t *plVar6;
  ZSTD_freeFunction p_Var7;
  ZSTD_allocFunction p_Var8;
  rawSeq *prVar9;
  bool bVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  U32 UVar14;
  U64 UVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  BYTE *pBVar19;
  void *pvVar20;
  ZSTD_compressedBlockState_t *pZVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  size_t __n;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  ldmEntry_t *__s;
  FSE_CTable *pFVar30;
  ZSTD_indexResetPolicy_e forceResetIndex;
  void *alloc;
  BYTE *pBVar31;
  seqDef *psVar32;
  void *pvVar33;
  rawSeq *prVar34;
  size_t local_60;
  
  auVar12 = vpaddd_avx(params.cParams._0_16_,_DAT_001a1300);
  auVar13 = vpminud_avx(auVar12,_DAT_001a1310);
  auVar12 = vpcmpeqd_avx(auVar12,auVar13);
  if (((((((auVar12 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
          (auVar12 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar12 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar12[0xf] < '\0')
       || (4 < params.cParams.minMatch - 3)) || (0x20000 < params.cParams.targetLength)) ||
     (8 < params.cParams.strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2fc8,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fcf,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fd0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (params.ldmParams.minMatchLength - 1 == 0) {
      UVar15 = 1;
    }
    else {
      lVar23 = -0x30e44323485a9b9d;
      UVar15 = 1;
      uVar27 = (ulong)(params.ldmParams.minMatchLength - 1);
      do {
        lVar26 = lVar23;
        if ((uVar27 & 1) == 0) {
          lVar26 = 1;
        }
        UVar15 = UVar15 * lVar26;
        lVar23 = lVar23 * lVar23;
        bVar10 = 1 < uVar27;
        uVar27 = uVar27 >> 1;
      } while (bVar10);
    }
    (zc->ldmState).hashPower = UVar15;
  }
  if (pledgedSrcSize == 0) {
    uVar27 = 1;
  }
  else {
    uVar27 = 1L << ((byte)params.cParams.windowLog & 0x3f);
    if (pledgedSrcSize <= uVar27) {
      uVar27 = pledgedSrcSize;
    }
  }
  uVar29 = 0x20000;
  if (uVar27 < 0x20000) {
    uVar29 = uVar27;
  }
  uVar11 = (uVar29 & 0xffffffff) / (ulong)((params.cParams.minMatch != 3) + 3);
  uVar16 = (ulong)(uint)((int)uVar11 << 3);
  if (zbuff == ZSTDb_buffered) {
    uVar24 = 0;
    if (uVar27 < 0x20000) {
      uVar24 = (ulong)(0x20000U - (int)uVar29 >> 0xb);
    }
    local_60 = (uVar29 >> 8) + uVar29 + uVar24 + 1;
  }
  else {
    local_60 = 0;
  }
  uVar24 = 0;
  uVar27 = uVar27 + uVar29;
  if (zbuff != ZSTDb_buffered) {
    uVar27 = uVar24;
  }
  sVar17 = ZSTD_sizeof_matchState(&params.cParams,1);
  UVar14 = params.ldmParams.enableLdm;
  uVar18 = 0;
  if (params.ldmParams.enableLdm != 0) {
    uVar18 = (uVar29 & 0xffffffff) / (ulong)params.ldmParams.minMatchLength;
  }
  iVar2 = (zc->workspace).workspaceOversizedDuration;
  (zc->workspace).workspaceOversizedDuration = iVar2 + 1;
  uVar25 = params.ldmParams.hashLog - params.ldmParams.bucketSizeLog;
  uVar22 = (ulong)uVar25;
  if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
    uVar22 = uVar24;
  }
  __n = 8L << ((byte)params.ldmParams.hashLog & 0x3f);
  if (params.ldmParams.enableLdm != 0) {
    uVar24 = (1L << ((byte)uVar22 & 0x3f)) + __n;
  }
  lVar26 = uVar11 * 3 + local_60 + uVar27 + uVar29 + uVar16 + sVar17;
  lVar23 = lVar26 + 0x4068;
  if (zc->staticSize == 0) {
    lVar23 = lVar26 + 0x3be0;
  }
  sVar28 = lVar23 + uVar18 * 0xc + 0x20 + uVar24;
  pvVar20 = (zc->workspace).workspace;
  pvVar33 = (zc->workspace).workspaceEnd;
  ws = &zc->workspace;
  if (((ulong)((long)pvVar33 - (long)pvVar20) < sVar28) ||
     (sVar28 * 3 <= (ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) &&
      0x7f < iVar2)) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    p_Var7 = (zc->customMem).customFree;
    pvVar33 = (zc->customMem).opaque;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).allocFailed = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    *(undefined8 *)&(zc->workspace).phase = 0;
    ws->workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    if (pvVar20 != (void *)0x0) {
      if (p_Var7 == (ZSTD_freeFunction)0x0) {
        free(pvVar20);
      }
      else {
        (*p_Var7)(pvVar33,pvVar20);
      }
    }
    p_Var8 = (zc->customMem).customAlloc;
    if (p_Var8 == (ZSTD_allocFunction)0x0) {
      pvVar20 = malloc(sVar28);
    }
    else {
      pvVar20 = (*p_Var8)((zc->customMem).opaque,sVar28);
    }
    if (pvVar20 == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (((ulong)pvVar20 & 7) != 0) {
      __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1dad,"void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t)");
    }
    (zc->workspace).workspace = pvVar20;
    (zc->workspace).workspaceEnd = (void *)(sVar28 + (long)pvVar20);
    (zc->workspace).objectEnd = pvVar20;
    (zc->workspace).tableValidEnd = pvVar20;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).tableEnd = pvVar20;
    (zc->workspace).allocStart = (void *)(sVar28 + (long)pvVar20);
    (zc->workspace).allocFailed = 0;
    ZSTD_cwksp_assert_internal_consistency(ws);
    (zc->workspace).workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x23e0) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3011,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar4 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
    if (((ulong)pZVar4 & 7) != 0) {
      __assert_fail("((size_t)alloc & (sizeof(void*)-1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x1d30,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((zc->workspace).phase != ZSTD_cwksp_alloc_objects) ||
       (pZVar1 = pZVar4 + 1, (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar1))
    {
      (zc->workspace).allocFailed = 1;
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    (zc->workspace).objectEnd = pZVar1;
    (zc->workspace).tableEnd = pZVar1;
    (zc->workspace).tableValidEnd = pZVar1;
    (zc->blockState).prevCBlock = pZVar4;
    if (pZVar4 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (((zc->workspace).phase != ZSTD_cwksp_alloc_objects) ||
       (pZVar21 = pZVar4 + 2, (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd < pZVar21)
       ) {
      (zc->workspace).allocFailed = 1;
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    (zc->workspace).objectEnd = pZVar21;
    (zc->workspace).tableEnd = pZVar21;
    (zc->workspace).tableValidEnd = pZVar21;
    (zc->blockState).nextCBlock = pZVar1;
    ZSTD_cwksp_assert_internal_consistency(ws);
    ZVar3 = (zc->workspace).phase;
    if ((ZVar3 == ZSTD_cwksp_alloc_objects) &&
       (pFVar30 = pZVar4[3].entropy.fse.offcodeCTable + 0x83,
       pFVar30 <= (zc->workspace).workspaceEnd)) {
      (zc->workspace).objectEnd = pFVar30;
      (zc->workspace).tableEnd = pFVar30;
      (zc->workspace).tableValidEnd = pFVar30;
    }
    else {
      (zc->workspace).allocFailed = 1;
      pZVar21 = (ZSTD_compressedBlockState_t *)0x0;
    }
    zc->entropyWorkspace = (U32 *)pZVar21;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pvVar33 = (zc->workspace).workspaceEnd;
    forceResetIndex = ZSTDirp_reset;
  }
  else {
    forceResetIndex =
         (ZSTD_indexResetPolicy_e)
         (zc->initialized == 0 ||
         0xdf000000 <
         (ulong)((long)(zc->blockState).matchState.window.nextSrc -
                (long)(zc->blockState).matchState.window.base));
    ZVar3 = (zc->workspace).phase;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = pvVar33;
  (zc->workspace).allocFailed = 0;
  if (1 < (int)ZVar3) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  memcpy(&zc->appliedParams,&params,0x90);
  (zc->blockState).matchState.cParams.windowLog =
       (int)CONCAT71(params.cParams._1_7_,(byte)params.cParams.windowLog);
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = SUB168(ZEXT816(0) << 0x20,0);
  zc->producedCSize = SUB168(ZEXT816(0) << 0x20,8);
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar29;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v1 = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v2 = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v3 = 0;
  (zc->xxhState).v4 = 0x61c8864e7a143579;
  (zc->xxhState).mem64[0] = 0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  (zc->xxhState).mem64[3] = 0;
  (zc->xxhState).memsize = 0;
  (zc->xxhState).reserved[0] = 0;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  pZVar4 = (zc->blockState).prevCBlock;
  lVar23 = 0;
  do {
    *(undefined4 *)((long)pZVar4->rep + lVar23) = *(undefined4 *)((long)repStartValue + lVar23);
    lVar23 = lVar23 + 4;
  } while (lVar23 != 0xc);
  (pZVar4->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar4->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar4->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  ZVar3 = (zc->workspace).phase;
  if ((int)ZVar3 < 2) {
    pBVar19 = (BYTE *)(zc->workspace).tableEnd;
    if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
    }
    pBVar31 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - uVar29));
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar19 <= pBVar31) {
      if (pBVar31 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar31;
      }
      (zc->workspace).allocStart = pBVar31;
      (zc->seqStore).litStart = pBVar31;
      (zc->seqStore).maxNbLit = uVar29;
      zc->inBuffSize = uVar27;
      ZVar3 = (zc->workspace).phase;
      if (1 < (int)ZVar3) goto LAB_0016bf3a;
      pBVar19 = (BYTE *)(zc->workspace).tableEnd;
      if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
        (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      }
      pBVar31 = pBVar31 + -uVar27;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar19 <= pBVar31) {
        if (pBVar31 < (zc->workspace).tableValidEnd) {
          (zc->workspace).tableValidEnd = pBVar31;
        }
        (zc->workspace).allocStart = pBVar31;
        zc->inBuff = (char *)pBVar31;
        zc->outBuffSize = local_60;
        ZVar3 = (zc->workspace).phase;
        if (1 < (int)ZVar3) goto LAB_0016bf3a;
        pBVar19 = (BYTE *)(zc->workspace).tableEnd;
        if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
          (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
          (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        }
        pBVar31 = pBVar31 + -local_60;
        ZSTD_cwksp_assert_internal_consistency(ws);
        if (pBVar19 <= pBVar31) {
          if (pBVar31 < (zc->workspace).tableValidEnd) {
            (zc->workspace).tableValidEnd = pBVar31;
          }
          (zc->workspace).allocStart = pBVar31;
          zc->outBuff = (char *)pBVar31;
          if (UVar14 != 0) {
            sVar28 = 1L << ((byte)uVar25 & 0x3f);
            ZVar3 = (zc->workspace).phase;
            if (1 < (int)ZVar3) goto LAB_0016bf3a;
            pBVar19 = (BYTE *)(zc->workspace).tableEnd;
            if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
              (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
              (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
            }
            pBVar31 = pBVar31 + -sVar28;
            ZSTD_cwksp_assert_internal_consistency(ws);
            if (pBVar31 < pBVar19) goto LAB_0016bf5c;
            if (pBVar31 < (zc->workspace).tableValidEnd) {
              (zc->workspace).tableValidEnd = pBVar31;
            }
            (zc->workspace).allocStart = pBVar31;
            (zc->ldmState).bucketOffsets = pBVar31;
            memset(pBVar31,0,sVar28);
          }
          if ((zc->stage == ZSTDcs_init) && ((zc->appliedParams).ldmParams.enableLdm == 0)) {
            (zc->externSeqStore).seq = (rawSeq *)0x0;
            (zc->externSeqStore).pos = 0;
            (zc->externSeqStore).size = 0;
            (zc->externSeqStore).capacity = 0;
          }
          (zc->seqStore).maxNbSeq = uVar11;
          ZVar3 = (zc->workspace).phase;
          if (1 < (int)ZVar3) goto LAB_0016bf3a;
          pBVar19 = (BYTE *)(zc->workspace).tableEnd;
          if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
            (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
            (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
          }
          pBVar31 = (BYTE *)((long)(zc->workspace).allocStart - uVar11);
          ZSTD_cwksp_assert_internal_consistency(ws);
          if (pBVar19 <= pBVar31) {
            if (pBVar31 < (zc->workspace).tableValidEnd) {
              (zc->workspace).tableValidEnd = pBVar31;
            }
            (zc->workspace).allocStart = pBVar31;
            (zc->seqStore).llCode = pBVar31;
            ZVar3 = (zc->workspace).phase;
            if (1 < (int)ZVar3) goto LAB_0016bf3a;
            pBVar19 = (BYTE *)(zc->workspace).tableEnd;
            if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
              (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
              (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
            }
            pBVar31 = pBVar31 + -uVar11;
            ZSTD_cwksp_assert_internal_consistency(ws);
            if (pBVar19 <= pBVar31) {
              if (pBVar31 < (zc->workspace).tableValidEnd) {
                (zc->workspace).tableValidEnd = pBVar31;
              }
              (zc->workspace).allocStart = pBVar31;
              (zc->seqStore).mlCode = pBVar31;
              ZVar3 = (zc->workspace).phase;
              if (1 < (int)ZVar3) goto LAB_0016bf3a;
              pBVar19 = (BYTE *)(zc->workspace).tableEnd;
              if (ZVar3 != ZSTD_cwksp_alloc_buffers) {
                (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
                (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
              }
              pBVar31 = pBVar31 + -uVar11;
              ZSTD_cwksp_assert_internal_consistency(ws);
              if (pBVar19 <= pBVar31) {
                pBVar19 = (BYTE *)(zc->workspace).tableValidEnd;
                if (pBVar31 < pBVar19) {
                  (zc->workspace).tableValidEnd = pBVar31;
                  pBVar19 = pBVar31;
                }
                (zc->workspace).allocStart = pBVar31;
                (zc->seqStore).ofCode = pBVar31;
                ZVar3 = (zc->workspace).phase;
                if (2 < (int)ZVar3) goto LAB_0016bf3a;
                psVar5 = (seqDef *)(zc->workspace).tableEnd;
                if (ZVar3 != ZSTD_cwksp_alloc_aligned) {
                  if ((int)ZVar3 < 1) {
                    pBVar19 = (BYTE *)(zc->workspace).objectEnd;
                    (zc->workspace).tableValidEnd = pBVar19;
                  }
                  pBVar31 = (BYTE *)((ulong)pBVar31 & 0xfffffffffffffffc);
                  (zc->workspace).allocStart = pBVar31;
                  if (pBVar31 < pBVar19) {
                    (zc->workspace).tableValidEnd = pBVar31;
                  }
                  (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
                }
                psVar32 = (seqDef *)(pBVar31 + -uVar16);
                ZSTD_cwksp_assert_internal_consistency(ws);
                if (psVar5 <= psVar32) {
                  if (psVar32 < (seqDef *)(zc->workspace).tableValidEnd) {
                    (zc->workspace).tableValidEnd = psVar32;
                  }
                  (zc->workspace).allocStart = psVar32;
                  (zc->seqStore).sequencesStart = psVar32;
                  sVar17 = ZSTD_reset_matchState
                                     (&(zc->blockState).matchState,ws,&params.cParams,crp,
                                      forceResetIndex,ZSTD_resetTarget_CCtx);
                  if (sVar17 < 0xffffffffffffff89) {
                    if (UVar14 != 0) {
                      ZVar3 = (zc->workspace).phase;
                      if (2 < (int)ZVar3) goto LAB_0016bf3a;
                      plVar6 = (ldmEntry_t *)(zc->workspace).tableEnd;
                      if (ZVar3 == ZSTD_cwksp_alloc_aligned) {
                        pvVar33 = (zc->workspace).allocStart;
                      }
                      else {
                        if ((int)ZVar3 < 1) {
                          pvVar20 = (zc->workspace).objectEnd;
                          (zc->workspace).tableValidEnd = pvVar20;
                        }
                        else {
                          pvVar20 = (zc->workspace).tableValidEnd;
                        }
                        pvVar33 = (void *)((ulong)(zc->workspace).allocStart & 0xfffffffffffffffc);
                        (zc->workspace).allocStart = pvVar33;
                        if (pvVar33 < pvVar20) {
                          (zc->workspace).tableValidEnd = pvVar33;
                        }
                        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
                      }
                      __s = (ldmEntry_t *)((long)pvVar33 - __n);
                      ZSTD_cwksp_assert_internal_consistency(ws);
                      if (__s < plVar6) goto LAB_0016bf5c;
                      if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
                        (zc->workspace).tableValidEnd = __s;
                      }
                      (zc->workspace).allocStart = __s;
                      (zc->ldmState).hashTable = __s;
                      memset(__s,0,__n);
                      ZVar3 = (zc->workspace).phase;
                      if (2 < (int)ZVar3) goto LAB_0016bf3a;
                      prVar9 = (rawSeq *)(zc->workspace).tableEnd;
                      if (ZVar3 == ZSTD_cwksp_alloc_aligned) {
                        pvVar33 = (zc->workspace).allocStart;
                      }
                      else {
                        if ((int)ZVar3 < 1) {
                          pvVar20 = (zc->workspace).objectEnd;
                          (zc->workspace).tableValidEnd = pvVar20;
                        }
                        else {
                          pvVar20 = (zc->workspace).tableValidEnd;
                        }
                        pvVar33 = (void *)((ulong)(zc->workspace).allocStart & 0xfffffffffffffffc);
                        (zc->workspace).allocStart = pvVar33;
                        if (pvVar33 < pvVar20) {
                          (zc->workspace).tableValidEnd = pvVar33;
                        }
                        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
                      }
                      prVar34 = (rawSeq *)((long)pvVar33 + uVar18 * -0xc);
                      ZSTD_cwksp_assert_internal_consistency(ws);
                      if (prVar34 < prVar9) goto LAB_0016bf5c;
                      if (prVar34 < (rawSeq *)(zc->workspace).tableValidEnd) {
                        (zc->workspace).tableValidEnd = prVar34;
                      }
                      (zc->workspace).allocStart = prVar34;
                      zc->ldmSequences = prVar34;
                      zc->maxNbLdmSequences = uVar18;
                      (zc->ldmState).window.base = "";
                      (zc->ldmState).window.dictBase = "";
                      (zc->ldmState).window.nextSrc = (BYTE *)"File %s";
                      (zc->ldmState).window.dictLimit = 1;
                      (zc->ldmState).window.lowLimit = 1;
                    }
                    zc->initialized = 1;
                    sVar17 = 0;
                  }
                  return sVar17;
                }
              }
            }
          }
        }
      }
    }
LAB_0016bf5c:
    __assert_fail("alloc >= bottom",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x1cdd,
                  "void *ZSTD_cwksp_reserve_internal(ZSTD_cwksp *, size_t, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
LAB_0016bf3a:
  __assert_fail("phase >= ws->phase",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x1cac,
                "void ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)");
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 const pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    zc->isFirstBlock = 1;

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);

        ZSTD_indexResetPolicy_e needsIndexReset = zc->initialized ? ZSTDirp_continue : ZSTDirp_reset;

        if (ZSTD_indexTooCloseToMax(zc->blockState.matchState.window)) {
            needsIndexReset = ZSTDirp_reset;
        }

        ZSTD_cwksp_bump_oversized_duration(ws, 0);

        /* Check if workspace is large enough, alloc a new one if needed */
        {   size_t const cctxSpace = zc->staticSize ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;
            size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
            size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
            size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize) + ZSTD_cwksp_alloc_size(buffOutSize);
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(maxNbLdmSeq * sizeof(rawSeq));

            size_t const neededSpace =
                cctxSpace +
                entropySpace +
                blockStateSpace +
                ldmSpace +
                ldmSeqSpace +
                matchStateSize +
                tokenSpace +
                bufferSpace;

            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workspaceTooSmall || workspaceWasteful) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem));

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, HUF_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, ldmBucketSize);
            memset(zc->ldmState.bucketOffsets, 0, ldmBucketSize);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params.cParams,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx));

        /* ldm hash table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            ZSTD_window_clear(&zc->ldmState.window);
        }

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        zc->initialized = 1;

        return 0;
    }
}